

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

void __thiscall
kj::_::BTreeImpl::renumber(BTreeImpl *this,uint oldRow,uint newRow,SearchKey *searchKey)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  NodeUnion *pNVar4;
  
  uVar3 = this->height;
  uVar2 = 0;
  if (uVar3 != 0) {
    do {
      pNVar4 = this->tree + uVar2;
      uVar1 = (**searchKey->_vptr_SearchKey)(searchKey,pNVar4);
      uVar2 = (ulong)uVar1;
      if ((uVar1 < 7) && (*(int *)((long)&pNVar4->field_0 + uVar2 * 4 + 4) == oldRow + 1)) {
        *(uint *)((long)&pNVar4->field_0 + uVar2 * 4 + 4) = newRow + 1;
      }
      uVar2 = (ulong)*(uint *)((long)&pNVar4->field_0 + uVar2 * 4 + 0x20);
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  pNVar4 = this->tree + uVar2;
  uVar1 = (*searchKey->_vptr_SearchKey[1])(searchKey,pNVar4);
  if (*(int *)((long)&pNVar4->field_0 + (ulong)uVar1 * 4 + 8) != oldRow + 1) {
    logInconsistency((BTreeImpl *)searchKey);
    return;
  }
  *(uint *)((long)&pNVar4->field_0 + (ulong)uVar1 * 4 + 8) = newRow + 1;
  return;
}

Assistant:

void BTreeImpl::renumber(uint oldRow, uint newRow, const SearchKey& searchKey) {
  // Renumber the given row from oldRow to newRow. predicate() returns true for oldRow and all
  // rows after it. (It will not be called on newRow.)

  uint pos = 0;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    auto& node = tree[pos].parent;
    uint indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];
    if (indexInParent < kj::size(node.keys) && node.keys[indexInParent] == oldRow) {
      node.keys[indexInParent] = newRow;
    }
    KJ_DASSERT(pos != 0);
  }

  auto& leaf = tree[pos].leaf;
  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == oldRow) {
    leaf.rows[r] = newRow;
  } else {
    logInconsistency();
  }
}